

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  char cVar1;
  Curl_addrinfo *pCVar2;
  int iVar3;
  Curl_hash *h;
  size_t sVar4;
  Curl_addrinfo *pCVar5;
  void *pvVar6;
  Curl_dns_entry *pCVar7;
  char *pcVar8;
  Curl_addrinfo *ai;
  Curl_str target;
  _Bool error;
  curl_off_t cStack_1d8;
  _Bool permanent;
  curl_off_t port;
  char *addresses;
  char address [64];
  size_t entry_len_1;
  Curl_addrinfo *tail;
  Curl_addrinfo *head;
  Curl_dns_entry *dns;
  size_t entry_len;
  curl_off_t num;
  Curl_str source;
  char *host;
  char entry_id [262];
  curl_slist *local_28;
  curl_slist *hostp;
  Curl_dnscache *dnscache;
  Curl_easy *data_local;
  
  h = &dnscache_get(data)->entries;
  if (h == (Curl_hash *)0x0) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xfffbffff;
    for (local_28 = (data->state).resolve; local_28 != (curl_slist *)0x0; local_28 = local_28->next)
    {
      source.len = (size_t)local_28->data;
      if ((char *)source.len != (char *)0x0) {
        if (*(char *)source.len == '-') {
          entry_len = 0;
          source.len = source.len + 1;
          iVar3 = Curl_str_single((char **)&source.len,'[');
          if (iVar3 == 0) {
            iVar3 = Curl_str_until((char **)&source.len,(Curl_str *)&num,0x2e,']');
            if ((iVar3 == 0) && (iVar3 = Curl_str_single((char **)&source.len,']'), iVar3 == 0)) {
              iVar3 = Curl_str_single((char **)&source.len,':');
              goto joined_r0x0014ba71;
            }
          }
          else {
            iVar3 = Curl_str_until((char **)&source.len,(Curl_str *)&num,0x1000,':');
            if (iVar3 == 0) {
              iVar3 = Curl_str_single((char **)&source.len,':');
joined_r0x0014ba71:
              if ((iVar3 == 0) &&
                 (iVar3 = Curl_str_number((char **)&source.len,(curl_off_t *)&entry_len,0xffff),
                 iVar3 == 0)) {
                sVar4 = create_dnscache_id((char *)num,(size_t)source.str,(int)entry_len,
                                           (char *)&host,0x106);
                dnscache_lock(data,(Curl_dnscache *)h);
                Curl_hash_delete(h,&host,sVar4 + 1);
                dnscache_unlock(data,(Curl_dnscache *)h);
              }
            }
          }
        }
        else {
          tail = (Curl_addrinfo *)0x0;
          entry_len_1 = 0;
          port = 0;
          cStack_1d8 = 0;
          target.len._6_1_ = 1;
          cVar1 = *(char *)source.len;
          if (cVar1 == '+') {
            source.len = source.len + 1;
          }
          target.len._7_1_ = cVar1 != '+';
          iVar3 = Curl_str_single((char **)&source.len,'[');
          if (iVar3 == 0) {
            iVar3 = Curl_str_until((char **)&source.len,(Curl_str *)&num,0x2e,']');
            if (iVar3 != 0) goto LAB_0014c12d;
            iVar3 = Curl_str_single((char **)&source.len,']');
          }
          else {
            iVar3 = Curl_str_until((char **)&source.len,(Curl_str *)&num,0x1000,':');
          }
          if (iVar3 == 0) {
            iVar3 = Curl_str_single((char **)&source.len,':');
            if (((iVar3 == 0) &&
                (iVar3 = Curl_str_number((char **)&source.len,&stack0xfffffffffffffe28,0xffff),
                iVar3 == 0)) && (iVar3 = Curl_str_single((char **)&source.len,':'), iVar3 == 0)) {
              port = source.len;
LAB_0014bc7c:
              do {
                if (*(char *)source.len == '\0') break;
                iVar3 = Curl_str_single((char **)&source.len,'[');
                if (iVar3 == 0) {
                  iVar3 = Curl_str_until((char **)&source.len,(Curl_str *)&ai,0x2e,']');
                  if ((iVar3 != 0) ||
                     (iVar3 = Curl_str_single((char **)&source.len,']'), iVar3 != 0))
                  goto LAB_0014be55;
                }
                else {
                  iVar3 = Curl_str_until((char **)&source.len,(Curl_str *)&ai,0x1000,',');
                  if (iVar3 != 0) {
                    iVar3 = Curl_str_single((char **)&source.len,',');
                    if (iVar3 != 0) goto LAB_0014be55;
                    goto LAB_0014bc7c;
                  }
                }
                if ((char *)0x3f < target.str) goto LAB_0014be55;
                memcpy(&addresses,ai,(size_t)target.str);
                *(char *)((long)&addresses + (long)target.str) = '\0';
                pCVar5 = Curl_str2addr((char *)&addresses,(int)cStack_1d8);
                if (pCVar5 == (Curl_addrinfo *)0x0) {
                  if (((data != (Curl_easy *)0x0) &&
                      ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
                     (((data->state).feat == (curl_trc_feat *)0x0 ||
                      (0 < ((data->state).feat)->log_level)))) {
                    Curl_infof(data,"Resolve address \'%s\' found illegal",&addresses);
                  }
                  goto LAB_0014be55;
                }
                pCVar2 = pCVar5;
                if (entry_len_1 != 0) {
                  *(Curl_addrinfo **)(entry_len_1 + 0x28) = pCVar5;
                  pCVar5 = (Curl_addrinfo *)*(size_t *)(entry_len_1 + 0x28);
                  pCVar2 = tail;
                }
                tail = pCVar2;
                entry_len_1 = (size_t)pCVar5;
                iVar3 = Curl_str_single((char **)&source.len,',');
              } while (iVar3 == 0);
              if (tail != (Curl_addrinfo *)0x0) {
                target.len._6_1_ = 0;
              }
            }
LAB_0014be55:
            if ((target.len._6_1_ & 1) != 0) {
              Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",local_28->data);
              Curl_freeaddrinfo(tail);
              return CURLE_SETOPT_OPTION_SYNTAX;
            }
            sVar4 = create_dnscache_id((char *)num,(size_t)source.str,(int)cStack_1d8,(char *)&host,
                                       0x106);
            dnscache_lock(data,(Curl_dnscache *)h);
            pvVar6 = Curl_hash_pick(h,&host,sVar4 + 1);
            if (pvVar6 != (void *)0x0) {
              if (((data != (Curl_easy *)0x0) &&
                  ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
                 (((data->state).feat == (curl_trc_feat *)0x0 ||
                  (0 < ((data->state).feat)->log_level)))) {
                Curl_infof(data,"RESOLVE %.*s:%ld - old addresses discarded",
                           (ulong)source.str & 0xffffffff,num,cStack_1d8);
              }
              Curl_hash_delete(h,&host,sVar4 + 1);
            }
            pCVar7 = dnscache_add_addr(data,(Curl_dnscache *)h,tail,(char *)num,(size_t)source.str,
                                       (int)cStack_1d8,(_Bool)(target.len._7_1_ & 1));
            if (pCVar7 != (Curl_dns_entry *)0x0) {
              pCVar7->refcount = pCVar7->refcount - 1;
            }
            dnscache_unlock(data,(Curl_dnscache *)h);
            if (pCVar7 == (Curl_dns_entry *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              pcVar8 = " (non-permanent)";
              if ((target.len._7_1_ & 1) != 0) {
                pcVar8 = "";
              }
              Curl_infof(data,"Added %.*s:%ld:%s to DNS cache%s",(ulong)source.str & 0xffffffff,num,
                         cStack_1d8,port,pcVar8);
            }
            iVar3 = Curl_str_casecompare((Curl_str *)&num,"*");
            if (iVar3 != 0) {
              if (((data != (Curl_easy *)0x0) &&
                  ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
                 (((data->state).feat == (curl_trc_feat *)0x0 ||
                  (0 < ((data->state).feat)->log_level)))) {
                Curl_infof(data,"RESOLVE *:%ld using wildcard",cStack_1d8);
              }
              *(uint *)&(data->state).field_0x7be =
                   *(uint *)&(data->state).field_0x7be & 0xfffbffff | 0x40000;
            }
          }
        }
      }
LAB_0014c12d:
    }
    (data->state).resolve = (curl_slist *)0x0;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct curl_slist *hostp;

  if(!dnscache)
    return CURLE_FAILED_INIT;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    const char *host = hostp->data;
    struct Curl_str source;
    if(!host)
      continue;
    if(*host == '-') {
      curl_off_t num = 0;
      size_t entry_len;
      host++;
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']') ||
           Curl_str_single(&host, ':'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':') ||
           Curl_str_single(&host, ':')) {
          continue;
        }
      }

      if(!Curl_str_number(&host, &num, 0xffff)) {
        /* Create an entry id, based upon the hostname and port */
        entry_len = create_dnscache_id(Curl_str(&source),
                                       Curl_strlen(&source), (int)num,
                                       entry_id, sizeof(entry_id));
        dnscache_lock(data, dnscache);
        /* delete entry, ignore if it did not exist */
        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
        dnscache_unlock(data, dnscache);
      }
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      const char *addresses = NULL;
#endif
      curl_off_t port = 0;
      bool permanent = TRUE;
      bool error = TRUE;

      if(*host == '+') {
        host++;
        permanent = FALSE;
      }
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':'))
          continue;
      }
      if(Curl_str_single(&host, ':') ||
         Curl_str_number(&host, &port, 0xffff) ||
         Curl_str_single(&host, ':'))
        goto err;

#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = host;
#endif

      /* start the address section */
      while(*host) {
        struct Curl_str target;
        struct Curl_addrinfo *ai;

        if(!Curl_str_single(&host, '[')) {
          if(Curl_str_until(&host, &target, MAX_IPADR_LEN, ']') ||
             Curl_str_single(&host, ']'))
            goto err;
        }
        else {
          if(Curl_str_until(&host, &target, 4096, ',')) {
            if(Curl_str_single(&host, ','))
              goto err;
            /* survive nothing but just a comma */
            continue;
          }
        }
#ifndef USE_IPV6
        if(memchr(target.str, ':', target.len)) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          if(Curl_str_single(&host, ','))
            goto err;
          continue;
        }
#endif

        if(Curl_strlen(&target) >= sizeof(address))
          goto err;

        memcpy(address, Curl_str(&target), Curl_strlen(&target));
        address[Curl_strlen(&target)] = '\0';

        ai = Curl_str2addr(address, (int)port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
        if(Curl_str_single(&host, ','))
          break;
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_dnscache_id(Curl_str(&source), Curl_strlen(&source),
                                     (int)port,
                                     entry_id, sizeof(entry_id));

      dnscache_lock(data, dnscache);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(&dnscache->entries, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%" CURL_FORMAT_CURL_OFF_T
              " - old addresses discarded", (int)Curl_strlen(&source),
              Curl_str(&source), port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = dnscache_add_addr(data, dnscache, head, Curl_str(&source),
                              Curl_strlen(&source), (int)port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      dnscache_unlock(data, dnscache);

      if(!dns)
        return CURLE_OUT_OF_MEMORY;

#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%" CURL_FORMAT_CURL_OFF_T ":%s to DNS cache%s",
            (int)Curl_strlen(&source), Curl_str(&source), port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if(Curl_str_casecompare(&source, "*")) {
        infof(data, "RESOLVE *:%" CURL_FORMAT_CURL_OFF_T " using wildcard",
              port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}